

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O2

void __thiscall
PrimitiveObjectsWriter::WriteName
          (PrimitiveObjectsWriter *this,string *inName,ETokenSeparator inSeparate)

{
  byte bVar1;
  IByteWriter *pIVar2;
  byte *pbVar3;
  long lVar4;
  size_t sVar5;
  byte *pbVar6;
  Byte buffer [5];
  
  pIVar2 = this->mStreamForWriting;
  if (pIVar2 != (IByteWriter *)0x0) {
    (*pIVar2->_vptr_IByteWriter[2])(pIVar2,"/",1);
    pbVar3 = (byte *)(inName->_M_dataplus)._M_p;
    for (pbVar6 = pbVar3; pbVar6 != pbVar3 + inName->_M_string_length; pbVar6 = pbVar6 + 1) {
      bVar1 = *pbVar6;
      if ((byte)(bVar1 + 0x81) < 0xa2) {
LAB_001ae171:
        sprintf((char *)buffer,"#%02x",(ulong)bVar1);
        pIVar2 = this->mStreamForWriting;
        sVar5 = strlen((char *)buffer);
        (*pIVar2->_vptr_IByteWriter[2])(pIVar2,buffer,sVar5);
      }
      else {
        lVar4 = std::__cxx11::string::find('\0',(ulong)(uint)(int)(char)bVar1);
        if (lVar4 != -1) goto LAB_001ae171;
        buffer[0] = bVar1;
        (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,buffer,1);
      }
      pbVar3 = (byte *)(inName->_M_dataplus)._M_p;
    }
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteName(const std::string& inName,ETokenSeparator inSeparate)
{
/*
from the pdf reference:
This syntax is required to represent any of the delimiter or white-space characters or the number sign character itself; 
it is recommended but not required for characters whose codes are outside the range 33 (!) to 126 (~).
*/
	if(!mStreamForWriting)
		return;

	mStreamForWriting->Write(scSlash,1);

	IOBasicTypes::Byte buffer[5];
	std::string::const_iterator it = inName.begin();
	for(;it != inName.end();++it)
	{
		Byte aValue = *it;

		if(aValue < 33 || aValue > 126 || scSpecialChars.find(aValue) != scSpecialChars.npos)
		{
			SAFE_SPRINTF_1((char*)buffer,5,"#%02x",aValue); 
			mStreamForWriting->Write(buffer,strlen((char*)buffer));		
		}
		else
		{
			buffer[0] = aValue;
			mStreamForWriting->Write(buffer,1);
		}
	}

	WriteTokenSeparator(inSeparate);
}